

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_demonfire(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int sn_00;
  int iVar2;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  undefined4 in_R8D;
  undefined4 unaff_retaddr;
  int oldhp;
  int dam_mod;
  int dam;
  CHAR_DATA *victim;
  int in_stack_0000008c;
  void *in_stack_00000090;
  CHAR_DATA *in_stack_00000098;
  int in_stack_000000a0;
  int in_stack_000000a4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int number;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  CHAR_DATA *pCVar3;
  
  iVar2 = in_RCX->hit;
  pCVar3 = in_RCX;
  bVar1 = is_opp_align(in_RCX,(CHAR_DATA *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (bVar1) {
    number = 5;
  }
  else {
    number = 4;
  }
  sn_00 = dice(number,iVar2);
  if (in_RCX != in_RDX) {
    act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,(void *)CONCAT44(sn_00,number),
        (void *)CONCAT44(iVar2,in_stack_ffffffffffffffc8),0);
    act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,(void *)CONCAT44(sn_00,number),
        (void *)CONCAT44(iVar2,in_stack_ffffffffffffffc8),0);
    send_to_char((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX);
  }
  bVar1 = saves_spell((int)victim,_dam_mod,oldhp);
  if (bVar1) {
    sn_00 = sn_00 / 2;
  }
  damage_old((CHAR_DATA *)CONCAT44(oldhp,unaff_retaddr),(CHAR_DATA *)CONCAT44(in_EDI,in_ESI),
             (int)((ulong)in_RDX >> 0x20),(int)in_RDX,(int)((ulong)pCVar3 >> 0x20),
             SUB81((ulong)pCVar3 >> 0x18,0));
  if (((in_RCX->ghost == 0) && (iVar2 = number_percent(), 0x4b < iVar2)) &&
     (bVar1 = is_affected_by(in_RCX,sn_00), !bVar1)) {
    spell_curse(in_stack_000000a4,in_stack_000000a0,in_stack_00000098,in_stack_00000090,
                in_stack_0000008c);
  }
  return;
}

Assistant:

void spell_demonfire(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int dam, dam_mod, oldhp;

	oldhp = victim->hit;

	if (is_opp_align(ch, victim))
		dam_mod = (int)5.5;
	else
		dam_mod = 4;

	dam = dice(level, dam_mod);

	if (victim != ch)
	{
		act("$n calls forth the demons of Hell upon $N!", ch, nullptr, victim, TO_NOTVICT);
		act("$n assails you with the demons of Hell!", ch, nullptr, victim, TO_VICT);
		send_to_char("You conjure forth the demons of hell!\n\r", ch);
	}

	if (saves_spell(level, victim, DAM_NEGATIVE))
		dam /= 2;

	damage_old(ch, victim, dam, sn, DAM_NEGATIVE, true);

	if (victim->ghost)
		return;

	if (number_percent() > 75 && !is_affected_by(victim, AFF_CURSE))
		spell_curse(gsn_curse, 3 * level / 4, ch, (void *)victim, TARGET_CHAR);
}